

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

bool __thiscall jrtplib::RTPSources::GotoFirstSourceWithData(RTPSources *this)

{
  RTPInternalSourceData *pRVar1;
  HashElement *pHVar2;
  
  pHVar2 = (this->sourcelist).firsthashelem;
  while( true ) {
    (this->sourcelist).curhashelem = pHVar2;
    if ((pHVar2 == (HashElement *)0x0) ||
       ((pRVar1 = pHVar2->element, (pRVar1->super_RTPSourceData).validated == true &&
        ((pRVar1->super_RTPSourceData).packetlist.
         super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
         _M_node.super__List_node_base._M_next !=
         (_List_node_base *)&(pRVar1->super_RTPSourceData).packetlist)))) break;
    pHVar2 = pHVar2->listnext;
  }
  return pHVar2 != (HashElement *)0x0;
}

Assistant:

bool RTPSources::GotoFirstSourceWithData()
{
	bool found = false;
	
	sourcelist.GotoFirstElement();
	while (!found && sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat;

		srcdat = sourcelist.GetCurrentElement();
		if (srcdat->HasData())
			found = true;
		else
			sourcelist.GotoNextElement();
	}
			
	return found;
}